

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData * GenerateLogoProfTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  undefined8 this;
  bool bVar1;
  reference sector_00;
  BitBuffer *bitstream;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  undefined1 local_a0 [8];
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = IsLogoProfTrack(track);
  if (!bVar1) {
    __assert_fail("IsLogoProfTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x251,"TrackData GenerateLogoProfTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_a0,false);
  TrackBuilder::addGap((TrackBuilder *)local_a0,600,-1);
  this = bitbuf.m_buffer._96_8_;
  __end1 = Track::begin((Track *)bitbuf.m_buffer._96_8_);
  sector = (Sector *)Track::end((Track *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&sector);
    if (!bVar1) break;
    sector_00 = __gnu_cxx::
                __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
                operator*(&__end1);
    if ((sector_00->header).sector != 1) {
      TrackBuilder::addSector((TrackBuilder *)local_a0,sector_00,0x20);
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_a0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateLogoProfTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsLogoProfTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();
    bitbuf.addGap(600);

    for (auto& sector : track)
    {
        if (sector.header.sector != 1)
            bitbuf.addSector(sector, 0x20);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}